

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testselectionwidget.cpp
# Opt level: O1

bool somethings_selected_proc(Am_Object *param_1)

{
  char cVar1;
  byte bVar2;
  Am_Value *pAVar3;
  Am_Value v;
  Am_Value local_18;
  
  cVar1 = Am_Object::Valid();
  if (cVar1 == '\0') {
    bVar2 = 0;
  }
  else {
    local_18.type = 0;
    local_18.value.wrapper_value = (Am_Wrapper *)0x0;
    pAVar3 = (Am_Value *)Am_Object::Get(0x5698,0x169);
    Am_Value::operator=(&local_18,pAVar3);
    bVar2 = Am_Value::Valid();
    bVar2 = bVar2 ^ 1;
    Am_Value::~Am_Value(&local_18);
  }
  return (bool)bVar2;
}

Assistant:

Am_Define_No_Self_Formula(bool, somethings_selected)
{
  if (my_selection.Valid()) {
    Am_Value v;
    v = my_selection.Get(Am_VALUE);
    return !v.Valid();
  } else
    return false;
}